

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.h
# Opt level: O2

grid_iterator<long> * __thiscall idx2::grid_iterator<long>::operator++(grid_iterator<long> *this)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  
  iVar2 = (this->S).field_0.field_0.X;
  iVar6 = (this->P).field_0.field_0.X + iVar2;
  (this->P).field_0.field_0.X = iVar6;
  plVar4 = this->Ptr + iVar2;
  this->Ptr = plVar4;
  iVar2 = (this->D).field_0.field_0.X;
  if (iVar2 <= iVar6) {
    (this->P).field_0.field_0.X = 0;
    iVar6 = (this->S).field_0.field_0.Y;
    iVar7 = (this->P).field_0.field_0.Y + iVar6;
    (this->P).field_0.field_0.Y = iVar7;
    lVar5 = (long)(this->N).field_0.field_0.X;
    this->Ptr = plVar4 + (iVar6 * lVar5 - (long)iVar2);
    iVar3 = (this->D).field_0.field_0.Y;
    if (iVar3 <= iVar7) {
      (this->P).field_0.field_0.Y = 0;
      iVar7 = (this->S).field_0.field_0.Z;
      piVar1 = &(this->P).field_0.field_0.Z;
      *piVar1 = *piVar1 + iVar7;
      this->Ptr = plVar4 + (iVar6 * lVar5 - (long)iVar2) +
                  ((long)(this->N).field_0.field_0.Y * iVar7 * lVar5 - iVar3 * lVar5);
    }
  }
  return this;
}

Assistant:

grid_iterator<t>&
grid_iterator<t>::operator++()
{
  P.X += S.X;
  Ptr += S.X;
  if (P.X >= D.X)
  {
    P.X = 0;
    P.Y += S.Y;
    Ptr = Ptr - D.X + (N.X * S.Y);
    if (P.Y >= D.Y)
    {
      P.Y = 0;
      P.Z += S.Z;
      Ptr = Ptr - D.Y * i64(N.X) + S.Z * i64(N.X) * N.Y;
    }
  }
  return *this;
}